

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall i2p::sam::Session::Hello(Session *this)

{
  Sock *sock;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  Session *in_RSI;
  long in_FS_OFFSET;
  Reply RStack_e8;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  Proxy::Connect((Proxy *)this);
  sock = (Sock *)(this->m_private_key_file).super_path._M_pathname._M_dataplus._M_p;
  if (sock == (Sock *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    Proxy::ToString_abi_cxx11_(&local_70,&in_RSI->m_control_host);
    tinyformat::format<std::__cxx11::string>
              (&local_50,(tinyformat *)"Cannot connect to %s",(char *)&local_70,in_RCX);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"HELLO VERSION MIN=3.1 MAX=3.1",(allocator<char> *)&local_70);
    SendRequestAndGetReply(&RStack_e8,in_RSI,sock,&local_50,true);
    Reply::~Reply(&RStack_e8);
    std::__cxx11::string::~string((string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Session::Hello() const
{
    auto sock = m_control_host.Connect();

    if (!sock) {
        throw std::runtime_error(strprintf("Cannot connect to %s", m_control_host.ToString()));
    }

    SendRequestAndGetReply(*sock, "HELLO VERSION MIN=3.1 MAX=3.1");

    return sock;
}